

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_rotate_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 arg1;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 pTVar1;
  TCGv_i32 X;
  int left;
  TCGv_i32 t1;
  TCGv_i32 t0;
  TCGv_i32 src;
  TCGv_i32 reg;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  pTVar1 = tcg_ctx_00->cpu_dregs[(int)(insn & 7)];
  arg1 = tcg_ctx_00->cpu_dregs[(int)((int)(uint)insn >> 9 & 7)];
  ret = tcg_temp_new_i32(tcg_ctx_00);
  tcg_gen_andi_i32_m68k(tcg_ctx_00,ret,arg1,0x3f);
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  if ((insn & 8) == 0) {
    tcg_gen_movi_i32(tcg_ctx_00,ret_00,0x21);
    tcg_gen_remu_i32_m68k(tcg_ctx_00,ret_00,ret,ret_00);
    pTVar1 = rotate32_x(tcg_ctx_00,tcg_ctx_00->cpu_dregs[(int)(insn & 7)],ret_00,insn & 0x100);
    rotate_x_flags(tcg_ctx_00,tcg_ctx_00->cpu_dregs[(int)(insn & 7)],pTVar1,0x20);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
  }
  else {
    tcg_gen_andi_i32_m68k(tcg_ctx_00,ret_00,arg1,0x1f);
    rotate(tcg_ctx_00,pTVar1,ret_00,insn & 0x100,0x20);
    tcg_gen_movcond_i32_m68k(tcg_ctx_00,TCG_COND_EQ,QREG_CC_C,ret,QREG_CC_V,QREG_CC_V,QREG_CC_C);
  }
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

DISAS_INSN(rotate_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv src;
    TCGv t0, t1;
    int left = (insn & 0x100);

    reg = DREG(insn, 0);
    src = DREG(insn, 9);
    /* shift in [0..63] */
    t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_andi_i32(tcg_ctx, t0, src, 63);
    t1 = tcg_temp_new_i32(tcg_ctx);
    if (insn & 8) {
        tcg_gen_andi_i32(tcg_ctx, t1, src, 31);
        rotate(tcg_ctx, reg, t1, left, 32);
        /* if shift == 0, clear C */
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, QREG_CC_C,
                            t0, QREG_CC_V /* 0 */,
                            QREG_CC_V /* 0 */, QREG_CC_C);
    } else {
        TCGv X;
        /* modulo 33 */
        tcg_gen_movi_i32(tcg_ctx, t1, 33);
        tcg_gen_remu_i32(tcg_ctx, t1, t0, t1);
        X = rotate32_x(tcg_ctx, DREG(insn, 0), t1, left);
        rotate_x_flags(tcg_ctx, DREG(insn, 0), X, 32);
        tcg_temp_free(tcg_ctx, X);
    }
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t0);
    set_cc_op(s, CC_OP_FLAGS);
}